

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

int Gia_ManDupOrderDfs_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  
  uVar3 = pObj->Value;
  if (uVar3 == 0xffffffff) {
    if (((uint)*(ulong *)pObj & 0x9fffffff) == 0x9fffffff) {
      pGVar4 = Gia_ManAppendObj(pNew);
      uVar1 = *(ulong *)pGVar4;
      *(ulong *)pGVar4 = uVar1 | 0x9fffffff;
      *(ulong *)pGVar4 =
           uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = pNew->pObjs;
      if ((pGVar4 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar4)) {
LAB_001d7260:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = pNew->pObjs;
      if ((pGVar4 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar4)) goto LAB_001d7260;
      uVar3 = (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * 0x55555556;
    }
    else {
      Gia_ManDupOrderDfs_rec(pNew,p,pObj + -(*(ulong *)pObj & 0x1fffffff));
      uVar1 = *(ulong *)pObj;
      if ((uVar1 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar1) {
        Gia_ManDupOrderDfs_rec(pNew,p,pObj + -(uVar1 >> 0x20 & 0x1fffffff));
        uVar1 = *(ulong *)pObj;
        if (((int)pObj[-(uVar1 & 0x1fffffff)].Value < 0) ||
           (uVar3 = (uint)(uVar1 >> 0x20), (int)pObj[-(ulong)(uVar3 & 0x1fffffff)].Value < 0)) {
LAB_001d727f:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar3 = Gia_ManAppendAnd(pNew,(uint)(uVar1 >> 0x1d) & 1 ^ pObj[-(uVar1 & 0x1fffffff)].Value,
                                 pObj[-(ulong)(uVar3 & 0x1fffffff)].Value ^ uVar3 >> 0x1d & 1);
      }
      else {
        if ((int)pObj[-(uVar1 & 0x1fffffff)].Value < 0) goto LAB_001d727f;
        uVar3 = Gia_ManAppendCo(pNew,pObj[-(uVar1 & 0x1fffffff)].Value ^ (uint)(uVar1 >> 0x1d) & 1);
      }
    }
    pObj->Value = uVar3;
  }
  return uVar3;
}

Assistant:

int Gia_ManDupOrderDfs_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( ~pObj->Value )
        return pObj->Value;
    if ( Gia_ObjIsCi(pObj) )
        return pObj->Value = Gia_ManAppendCi(pNew);
//    if ( p->pNexts && Gia_ObjNext(p, Gia_ObjId(p, pObj)) )
//        Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjNextObj(p, Gia_ObjId(p, pObj)) );
    Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
    if ( Gia_ObjIsCo(pObj) )
        return pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjFanin1(pObj) );
    return pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}